

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpki.c
# Opt level: O0

err_t bpkiCSRUnwrap(octet *pubkey,size_t *pubkey_len,octet *csr,size_t csr_len)

{
  bool_t bVar1;
  size_t sVar2;
  blob_t src;
  size_t in_RCX;
  void *in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  octet *hash;
  size_t oid_len;
  octet oid_der [16];
  bign_params params [1];
  bpki_csr_info_t ci [1];
  size_t count;
  err_t code;
  bign_params *in_stack_fffffffffffffe38;
  size_t *count_00;
  octet *in_stack_fffffffffffffe48;
  octet *in_stack_fffffffffffffea8;
  octet *in_stack_fffffffffffffeb0;
  octet *in_stack_fffffffffffffeb8;
  size_t in_stack_fffffffffffffec0;
  octet *in_stack_fffffffffffffec8;
  bign_params *in_stack_fffffffffffffed0;
  size_t in_stack_ffffffffffffff58;
  octet *in_stack_ffffffffffffff60;
  bpki_csr_info_t *in_stack_ffffffffffffff68;
  err_t local_4;
  
  count_00 = (size_t *)&DAT_00000010;
  bVar1 = memIsValid(in_RDX,in_RCX);
  if (bVar1 == 0) {
    local_4 = 0x6d;
  }
  else {
    sVar2 = bpkiCSRDec(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58
                      );
    if ((sVar2 == 0xffffffffffffffff) || (sVar2 != in_RCX)) {
      local_4 = 0x132;
    }
    else {
      local_4 = bignParamsStd(in_stack_fffffffffffffe38,(char *)0x14f62d);
      if ((local_4 == 0) &&
         (local_4 = bignOidToDER(in_stack_fffffffffffffe48,count_00,
                                 (char *)in_stack_fffffffffffffe38), local_4 == 0)) {
        src = blobCreate((size_t)in_stack_fffffffffffffe38);
        if (src == (blob_t)0x0) {
          local_4 = 0x6e;
        }
        else {
          local_4 = beltHash(in_stack_fffffffffffffe48,count_00,(size_t)src);
          if (local_4 == 0) {
            local_4 = bignVerify(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                                 in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                                 in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
            blobClose((blob_t)0x14f745);
            if (local_4 == 0) {
              if (in_RSI != (undefined8 *)0x0) {
                *in_RSI = 0x40;
              }
              if (in_RDI != 0) {
                memMove(count_00,src,0x14f7a6);
              }
              local_4 = 0;
            }
          }
          else {
            blobClose((blob_t)0x14f6ea);
          }
        }
      }
    }
  }
  return local_4;
}

Assistant:

err_t bpkiCSRUnwrap(octet pubkey[], size_t* pubkey_len, const octet csr[],
	size_t csr_len)
{
	err_t code;
	size_t count;
	bpki_csr_info_t ci[1];
	bign_params params[1];
	octet oid_der[16];
	size_t oid_len = sizeof(oid_der);
	octet* hash;
	// входной контроль
	if (!memIsValid(csr, csr_len))
		return ERR_BAD_INPUT;
	// разобрать запрос
	count = bpkiCSRDec(ci, csr, csr_len);
	if (count == SIZE_MAX || count != csr_len)
		return ERR_BAD_FORMAT;
	// загрузить стандартные параметры
	code = bignParamsStd(params, oid_bign_curve256v1);
	ERR_CALL_CHECK(code);
	// кодировать идентификатор алгоритма хэширования
	code = bignOidToDER(oid_der, &oid_len, oid_belt_hash);
	ERR_CALL_CHECK(code);
	// хэшировать
	if (!(hash = blobCreate(32)))
		return ERR_OUTOFMEMORY;
	code = beltHash(hash, csr + ci->body_offset, ci->body_len);
	ERR_CALL_HANDLE(code, blobClose(hash));
	// проверить подпись
	code = bignVerify(params, oid_der, oid_len, hash, csr + ci->sig_offset,
		csr + ci->pubkey_offset);
	blobClose(hash);
	ERR_CALL_CHECK(code);
	// завершить
	if (pubkey_len)
	{
		ASSERT(memIsValid(pubkey_len, O_PER_S));
		*pubkey_len = 64;
	}
	if (pubkey)
	{
		ASSERT(memIsValid(pubkey, 64));
		memMove(pubkey, csr + ci->pubkey_offset, 64);
	}
	return ERR_OK;
}